

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void outflushn_stream(out_stream_info *stream,int nl)

{
  ushort **ppuVar1;
  size_t sVar2;
  int in_ESI;
  long in_RDI;
  bool bVar3;
  int countnl;
  char *suffix;
  int i;
  int *in_stack_000007e8;
  char *in_stack_000007f0;
  int in_stack_000007fc;
  out_stream_info *in_stack_00000800;
  char *local_18;
  int local_10;
  
  *(undefined1 *)(in_RDI + 0x10 + (ulong)*(byte *)(in_RDI + 8)) = 0;
  local_10 = *(byte *)(in_RDI + 8) - 1;
  if ((in_ESI != 0) && (in_ESI != 4)) {
    while( true ) {
      bVar3 = false;
      if ((-1 < local_10) && (bVar3 = false, *(byte *)(in_RDI + 0x10 + (long)local_10) < 0x80)) {
        ppuVar1 = __ctype_b_loc();
        bVar3 = ((*ppuVar1)[(int)(uint)*(byte *)(in_RDI + 0x10 + (long)local_10)] & 0x2000) != 0;
      }
      if (!bVar3) break;
      local_10 = local_10 + -1;
    }
  }
  if (in_ESI == 3) {
    if (*(int *)(in_RDI + 0x2834) < local_10 + 1) {
      t_outline(in_stack_00000800,in_stack_000007fc,in_stack_000007f0,in_stack_000007e8);
      sVar2 = strlen((char *)(in_RDI + 0x10 + (long)*(int *)(in_RDI + 0x2834)));
      *(int *)(in_RDI + 0x2834) = *(int *)(in_RDI + 0x2834) + (int)sVar2;
    }
  }
  else {
    *(undefined1 *)((long)local_10 + 0x11 + in_RDI) = 0;
    switch(in_ESI) {
    case 0:
    case 3:
    case 4:
      local_18 = (char *)0x0;
      break;
    case 1:
      if (((*(char *)(in_RDI + 9) == '\0') && (*(int *)(in_RDI + 0x2838) != 0)) &&
         (*(int *)(in_RDI + 0x296c) == 0)) {
        local_18 = (char *)0x0;
      }
      else {
        local_18 = "\n";
      }
      break;
    case 2:
      local_18 = " ";
    }
    if ((((*(char *)(in_RDI + 0x10 + (long)*(int *)(in_RDI + 0x2834)) != '\0') ||
         ((*(char *)(in_RDI + 9) != '\0' && (*(int *)(in_RDI + 0x2838) == 0)))) ||
        (0 < *(int *)(in_RDI + 0x296c))) &&
       (t_outline(in_stack_00000800,in_stack_000007fc,in_stack_000007f0,in_stack_000007e8),
       local_18 != (char *)0x0)) {
      t_outline(in_stack_00000800,in_stack_000007fc,in_stack_000007f0,in_stack_000007e8);
    }
    if (((in_ESI == 1) && (*(int *)(in_RDI + 0x284c) != 0)) && (*(int *)(in_RDI + 0x2844) != 0)) {
      t_outline(in_stack_00000800,in_stack_000007fc,in_stack_000007f0,in_stack_000007e8);
    }
    if (in_ESI == 0) {
      os_flush();
    }
    else {
      *(undefined1 *)(in_RDI + 9) = 0;
    }
    *(undefined4 *)(in_RDI + 0x2834) = 0;
    *(undefined1 *)(in_RDI + 8) = 0;
    if (in_ESI == 1) {
      *(undefined4 *)(in_RDI + 0x2838) = 1;
    }
    else if (*(char *)(in_RDI + 0x10 + (long)*(int *)(in_RDI + 0x2834)) != '\0') {
      *(undefined4 *)(in_RDI + 0x2838) = 0;
    }
  }
  if (*(int *)(in_RDI + 0x2810) != *(int *)(in_RDI + 0x2814)) {
    os_set_text_attr(*(int *)(in_RDI + 0x2810));
    *(undefined4 *)(in_RDI + 0x2814) = *(undefined4 *)(in_RDI + 0x2810);
  }
  return;
}

Assistant:

static void outflushn_stream(out_stream_info *stream, int nl)
{
    int i;

    /* null-terminate the current output line buffer */
    stream->linebuf[stream->linepos] = '\0';

    /* note the position of the last character to display */
    i = stream->linepos - 1;

    /* if we're adding anything, remove trailing spaces */
    if (nl != 0 && nl != 4)
    {
        /* look for last non-space character */
        for ( ; i >= 0 && outissp(stream->linebuf[i]) ; --i) ;
    }

    /* check the output mode */
    if (nl == 3)
    {
        /* 
         *   this is the special "preview" mode -- only display the part
         *   that we haven't already previewed for this same line
         */
        if (i + 1 > stream->preview)
        {
            /* write out the line */
            t_outline(stream, 0, &stream->linebuf[stream->preview],
                      &stream->attrbuf[stream->preview]);

            /* skip past the part we wrote */
            stream->preview += strlen(&stream->linebuf[stream->preview]);
        }
    }
    else
    {
        char *suffix;           /* extra text to add after the flushed text */
        int   countnl = 0;         /* true if line counts for [more] paging */

        /* null-terminate the buffer at the current position */
        stream->linebuf[++i] = '\0';

        /* check the mode */
        switch(nl)
        {
        case 0:
        case 3:
        case 4:
            /* no newline - just flush out what we have with no suffix */
            suffix = 0;
            break;

        case 1:
            /* 
             *   Add a newline.  If there's nothing in the current line,
             *   or we just wrote out a newline, do not add an extra
             *   newline.  Keep all newlines in PRE mode.
             */
            if (stream->linecol != 0 || !stream->just_did_nl
                || stream->html_pre_level != 0)
            {
                /* add a newline after the text */
                suffix = "\n";
                
                /* count the line in the page size */
                countnl = 1;
            }
            else
            {
                /* don't add a newline */
                suffix = 0;
            }
            break;

        case 2:
            /* 
             *   we're going to depend on the underlying OS output layer
             *   to do line breaking, so don't add a newline, but do add a
             *   space, so that the underlying OS layer knows we have a
             *   word break here 
             */
            suffix = " ";
            break;
        }

        /* 
         *   display the line, as long as we have something buffered to
         *   display; even if we don't, display it if our column is
         *   non-zero and we didn't just do a newline, since this must
         *   mean that we've flushed a partial line and are just now doing
         *   the newline 
         */
        if (stream->linebuf[stream->preview] != '\0'
            || (stream->linecol != 0 && !stream->just_did_nl)
            || stream->html_pre_level > 0)
        {
            /* write it out */
            t_outline(stream, countnl, &stream->linebuf[stream->preview],
                      &stream->attrbuf[stream->preview]);

            /* write the suffix, if any */
            if (suffix != 0)
                t_outline(stream, 0, suffix, 0);
        }

        /* generate an HTML line break if necessary */
        if (nl == 1 && stream->html_mode && stream->html_target)
            t_outline(stream, 0, "<BR HEIGHT=0>", 0);

        if (nl == 0)
        {
            /* we're not displaying a newline, so flush what we have */
            os_flush();
        }
        else
        {
            /* we displayed a newline, so reset the column position */
            stream->linecol = 0;
        }

        /* reset the line output buffer position */
        stream->linepos = stream->preview = 0;

        /* 
         *   If we just output a newline, note it.  If we didn't just
         *   output a newline, but we did write out anything else, note
         *   that we're no longer at the start of a line on the underlying
         *   output device.  
         */
        if (nl == 1)
            stream->just_did_nl = TRUE;
        else if (stream->linebuf[stream->preview] != '\0')
            stream->just_did_nl = FALSE;
    }

    /* 
     *   If the osifc-level attributes don't match the current attributes,
     *   bring the osifc layer up to date.  This is necessary in cases where
     *   we set attributes immediately before asking for input - we
     *   essentially need to flush the attributes without flushing any text.
     */
    if (stream->cur_attr != stream->os_attr)
    {
        /* set the osifc attributes */
        os_set_text_attr(stream->cur_attr);

        /* remember the new attributes as the current osifc attributes */
        stream->os_attr = stream->cur_attr;
    }
}